

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumbfile.c
# Opt level: O0

int32 dumbfile_igetl(DUMBFILE *f)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long *in_RDI;
  uint32 b;
  uint32 rv;
  uint local_4;
  
  if (in_RDI[2] < 0) {
    local_4 = 0xffffffff;
  }
  else {
    uVar1 = (**(code **)(*in_RDI + 0x10))(in_RDI[1]);
    if ((int)uVar1 < 0) {
      in_RDI[2] = -1;
      local_4 = uVar1;
    }
    else {
      local_4 = (**(code **)(*in_RDI + 0x10))(in_RDI[1]);
      if ((int)local_4 < 0) {
        in_RDI[2] = -1;
      }
      else {
        uVar2 = local_4 << 8;
        local_4 = (**(code **)(*in_RDI + 0x10))(in_RDI[1]);
        if ((int)local_4 < 0) {
          in_RDI[2] = -1;
        }
        else {
          uVar3 = local_4 << 0x10;
          local_4 = (**(code **)(*in_RDI + 0x10))(in_RDI[1]);
          if ((int)local_4 < 0) {
            in_RDI[2] = -1;
          }
          else {
            local_4 = local_4 << 0x18 | uVar3 | uVar2 | uVar1;
            in_RDI[2] = in_RDI[2] + 4;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int32 DUMBEXPORT dumbfile_igetl(DUMBFILE *f)
{
	uint32 rv, b;

	ASSERT(f);

	if (f->pos < 0)
		return -1;

	rv = (*f->dfs->getc)(f->file);
	if ((sint32)rv < 0) {
		f->pos = -1;
		return rv;
	}

	b = (*f->dfs->getc)(f->file);
	if ((sint32)b < 0) {
		f->pos = -1;
		return b;
	}
	rv |= b << 8;

	b = (*f->dfs->getc)(f->file);
	if ((sint32)b < 0) {
		f->pos = -1;
		return b;
	}
	rv |= b << 16;

	b = (*f->dfs->getc)(f->file);
	if ((sint32)b < 0) {
		f->pos = -1;
		return b;
	}
	rv |= b << 24;

	f->pos += 4;

	return rv;
}